

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac__seek_to_approximate_flac_frame_to_byte
                    (ma_dr_flac *pFlac,ma_uint64 targetByte,ma_uint64 rangeLo,ma_uint64 rangeHi,
                    ma_uint64 *pLastSuccessfulSeekOffset)

{
  ma_bool32 mVar1;
  ma_uint64 mVar2;
  ma_uint64 mVar3;
  char cVar4;
  
  *pLastSuccessfulSeekOffset = pFlac->firstFLACFramePosInBytes;
  do {
    mVar1 = ma_dr_flac__seek_to_byte(&pFlac->bs,targetByte);
    if (mVar1 == 0) {
      if (targetByte != 0) goto LAB_00191c27;
      ma_dr_flac__seek_to_byte(&pFlac->bs,pFlac->firstFLACFramePosInBytes);
      memset(&pFlac->currentFLACFrame,0,0xa8);
      cVar4 = '\x01';
      mVar3 = 0;
    }
    else {
      memset(&pFlac->currentFLACFrame,0,0xa0);
      mVar1 = ma_dr_flac__read_and_decode_next_flac_frame(pFlac);
      cVar4 = '\x02';
      mVar3 = targetByte;
      if (mVar1 == 0) {
LAB_00191c27:
        mVar3 = (rangeHi - rangeLo >> 1) + rangeLo;
        cVar4 = mVar3 == targetByte;
        rangeHi = mVar3;
      }
    }
    targetByte = mVar3;
    if (cVar4 != '\0') {
      if (cVar4 == '\x01') {
        mVar1 = 0;
      }
      else {
        mVar2 = (pFlac->currentFLACFrame).header.pcmFrameNumber;
        if (mVar2 == 0) {
          mVar2 = (ulong)pFlac->maxBlockSizeInPCMFrames *
                  (ulong)(pFlac->currentFLACFrame).header.flacFrameNumber;
        }
        pFlac->currentPCMFrame = mVar2;
        *pLastSuccessfulSeekOffset = mVar3;
        mVar1 = 1;
      }
      return mVar1;
    }
  } while( true );
}

Assistant:

static ma_bool32 ma_dr_flac__seek_to_approximate_flac_frame_to_byte(ma_dr_flac* pFlac, ma_uint64 targetByte, ma_uint64 rangeLo, ma_uint64 rangeHi, ma_uint64* pLastSuccessfulSeekOffset)
{
    MA_DR_FLAC_ASSERT(pFlac != NULL);
    MA_DR_FLAC_ASSERT(pLastSuccessfulSeekOffset != NULL);
    MA_DR_FLAC_ASSERT(targetByte >= rangeLo);
    MA_DR_FLAC_ASSERT(targetByte <= rangeHi);
    *pLastSuccessfulSeekOffset = pFlac->firstFLACFramePosInBytes;
    for (;;) {
        ma_uint64 lastTargetByte = targetByte;
        if (!ma_dr_flac__seek_to_byte(&pFlac->bs, targetByte)) {
            if (targetByte == 0) {
                ma_dr_flac__seek_to_first_frame(pFlac);
                return MA_FALSE;
            }
            targetByte = rangeLo + ((rangeHi - rangeLo)/2);
            rangeHi = targetByte;
        } else {
            MA_DR_FLAC_ZERO_MEMORY(&pFlac->currentFLACFrame, sizeof(pFlac->currentFLACFrame));
#if 1
            if (!ma_dr_flac__read_and_decode_next_flac_frame(pFlac)) {
                targetByte = rangeLo + ((rangeHi - rangeLo)/2);
                rangeHi = targetByte;
            } else {
                break;
            }
#else
            if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
                targetByte = rangeLo + ((rangeHi - rangeLo)/2);
                rangeHi = targetByte;
            } else {
                break;
            }
#endif
        }
        if(targetByte == lastTargetByte) {
            return MA_FALSE;
        }
    }
    ma_dr_flac__get_pcm_frame_range_of_current_flac_frame(pFlac, &pFlac->currentPCMFrame, NULL);
    MA_DR_FLAC_ASSERT(targetByte <= rangeHi);
    *pLastSuccessfulSeekOffset = targetByte;
    return MA_TRUE;
}